

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_31::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  bool bVar1;
  PromiseFulfiller<void> *pPVar2;
  reference pvVar3;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  long in_RSI;
  Promise<void> PVar5;
  PropagateException local_78 [8];
  long local_70;
  long local_68;
  Type local_60;
  long local_50;
  TimePoint time;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_38;
  undefined1 local_21;
  Own<kj::PromiseFulfiller<void>_> *local_20;
  Own<kj::PromiseFulfiller<void>_> *f;
  NetworkAddressHttpClient *this_local;
  
  this_local = this;
  bVar1 = std::
          deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
          ::empty((deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                   *)(in_RSI + 0x60));
  if (bVar1) {
    *(undefined1 *)(in_RSI + 0x4c) = 0;
    if ((*(int *)(in_RSI + 0x48) == 0) &&
       (local_20 = _::readMaybe<kj::PromiseFulfiller<void>>
                             ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x38)),
       local_20 != (Own<kj::PromiseFulfiller<void>_> *)0x0)) {
      pPVar2 = Own<kj::PromiseFulfiller<void>_>::get(local_20);
      (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,&local_21);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_38,(void *)0x0);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x38),&local_38);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_38);
    }
    Promise<void>::Promise((Promise<void> *)this);
    pPVar4 = extraout_RDX;
  }
  else {
    pvVar3 = std::
             deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
             ::front((deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                      *)(in_RSI + 0x60));
    local_68 = (pvVar3->expires).value.value;
    local_50 = local_68;
    (**(code **)(**(long **)(in_RSI + 8) + 8))(&local_60,*(long **)(in_RSI + 8),local_68);
    local_70 = local_50;
    Promise<void>::
    then<kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)this,&local_60,local_78);
    Promise<void>::~Promise((Promise<void> *)&local_60);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_MAYBE(f, drainedFulfiller) {
          f->get()->fulfill();
          drainedFulfiller = nullptr;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }